

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

void term_reconfig(Terminal *term,Conf *conf)

{
  bidi_cache_entry *pbVar1;
  bool bVar2;
  _Bool _Var3;
  _Bool _Var4;
  _Bool _Var5;
  _Bool _Var6;
  _Bool _Var7;
  _Bool _Var8;
  _Bool _Var9;
  _Bool _Var10;
  _Bool _Var11;
  _Bool _Var12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  char *pcVar17;
  char *__s2;
  Conf *conf_00;
  int iVar18;
  ulong uVar19;
  long lVar20;
  
  _Var3 = conf_get_bool(term->conf,0x6c);
  _Var4 = conf_get_bool(conf,0x6c);
  _Var5 = conf_get_bool(term->conf,0x6b);
  _Var6 = conf_get_bool(conf,0x6b);
  _Var7 = conf_get_bool(term->conf,0x7a);
  _Var8 = conf_get_bool(conf,0x7a);
  _Var9 = conf_get_bool(term->conf,0x7b);
  _Var10 = conf_get_bool(conf,0x7b);
  bVar2 = false;
  for (iVar18 = 0; iVar18 != 0x100; iVar18 = iVar18 + 1) {
    iVar13 = conf_get_int_int(term->conf,0x9d,iVar18);
    iVar14 = conf_get_int_int(conf,0x9d,iVar18);
    bVar2 = (bool)(bVar2 | iVar13 != iVar14);
  }
  _Var11 = conf_get_bool(term->conf,0x8d);
  _Var12 = conf_get_bool(conf,0x8d);
  if (_Var11 == _Var12) {
    _Var11 = conf_get_bool(term->conf,0x8e);
    _Var12 = conf_get_bool(conf,0x8e);
    if (_Var11 == _Var12) goto LAB_00108299;
  }
  lVar20 = 8;
  for (uVar19 = 0; uVar19 < term->bidi_cache_size; uVar19 = uVar19 + 1) {
    safefree(*(void **)((long)&term->pre_bidi_cache->width + lVar20));
    safefree(*(void **)((long)&term->post_bidi_cache->width + lVar20));
    pbVar1 = term->pre_bidi_cache;
    *(undefined4 *)((long)pbVar1 + lVar20 + -8) = 0xffffffff;
    *(undefined8 *)((long)&pbVar1->width + lVar20) = 0;
    pbVar1 = term->post_bidi_cache;
    *(undefined4 *)((long)pbVar1 + lVar20 + -8) = 0xffffffff;
    *(undefined8 *)((long)&pbVar1->width + lVar20) = 0;
    lVar20 = lVar20 + 0x20;
  }
LAB_00108299:
  pcVar17 = conf_get_str(term->conf,0x69);
  __s2 = conf_get_str(conf,0x69);
  iVar18 = strcmp(pcVar17,__s2);
  if (iVar18 != 0) {
    safefree(term->window_title);
    pcVar17 = dupstr(__s2);
    term->window_title = pcVar17;
    term->wintitle_codepage = L'\xffff';
    term->win_title_pending = true;
    term_schedule_update(term);
  }
  iVar18 = 0;
  for (uVar16 = 0; uVar16 != 0x16; uVar16 = uVar16 + 1) {
    iVar13 = 0;
    while (iVar13 != 3) {
      iVar14 = conf_get_int_int(term->conf,0x95,iVar13 + iVar18);
      iVar15 = conf_get_int_int(conf,0x95,iVar13 + iVar18);
      iVar13 = iVar13 + 1;
      if (iVar14 != iVar15) goto LAB_00108378;
    }
    iVar18 = iVar18 + 3;
  }
LAB_00108378:
  conf_free(term->conf);
  conf_00 = conf_copy(conf);
  term->conf = conf_00;
  if (_Var3 != _Var4) {
    _Var3 = conf_get_bool(conf_00,0x6c);
    term->wrap = _Var3;
    term->alt_wrap = _Var3;
  }
  if (_Var5 != _Var6) {
    _Var3 = conf_get_bool(term->conf,0x6b);
    term->dec_om = _Var3;
    term->alt_om = _Var3;
  }
  if (_Var7 != _Var8) {
    _Var3 = conf_get_bool(term->conf,0x7a);
    term->use_bce = _Var3;
    set_erase_char(term);
  }
  if (_Var9 != _Var10) {
    _Var3 = conf_get_bool(term->conf,0x7b);
    term->blink_is_real = _Var3;
  }
  if (bVar2) {
    for (lVar20 = 0; lVar20 != 0x100; lVar20 = lVar20 + 1) {
      iVar18 = conf_get_int_int(term->conf,0x9d,(int)lVar20);
      term->wordness[lVar20] = (short)iVar18;
    }
  }
  _Var3 = conf_get_bool(term->conf,0x50);
  if (_Var3) {
    swap_screen(term,L'\0',false,false);
  }
  _Var3 = conf_get_bool(term->conf,0x54);
  if (_Var3) {
    term->cset_attr[0] = L'\xd800';
    term->cset_attr[1] = L'\xd800';
    term->alt_sco_acs = L'\0';
    term->sco_acs = L'\0';
    term->utf = false;
  }
  pcVar17 = conf_get_str(term->conf,0x8c);
  if (pcVar17 == (char *)0x0) {
    term_print_finish(term);
  }
  if (uVar16 < 0x16) {
    term_notify_palette_changed(term);
  }
  term_schedule_tblink(term);
  term_schedule_cblink(term);
  term_copy_stuff_from_conf(term);
  term_update_raw_mouse_mode(term);
  return;
}

Assistant:

void term_reconfig(Terminal *term, Conf *conf)
{
    /*
     * Before adopting the new config, check all those terminal
     * settings which control power-on defaults; and if they've
     * changed, we will modify the current state as well as the
     * default one. The full list is: Auto wrap mode, DEC Origin
     * Mode, BCE, blinking text, character classes.
     */
    bool reset_wrap, reset_decom, reset_bce, reset_tblink, reset_charclass;
    bool palette_changed = false;
    int i;

    reset_wrap = (conf_get_bool(term->conf, CONF_wrap_mode) !=
                  conf_get_bool(conf, CONF_wrap_mode));
    reset_decom = (conf_get_bool(term->conf, CONF_dec_om) !=
                   conf_get_bool(conf, CONF_dec_om));
    reset_bce = (conf_get_bool(term->conf, CONF_bce) !=
                 conf_get_bool(conf, CONF_bce));
    reset_tblink = (conf_get_bool(term->conf, CONF_blinktext) !=
                    conf_get_bool(conf, CONF_blinktext));
    reset_charclass = false;
    for (i = 0; i < 256; i++)
        if (conf_get_int_int(term->conf, CONF_wordness, i) !=
            conf_get_int_int(conf, CONF_wordness, i))
            reset_charclass = true;

    /*
     * If the bidi or shaping settings have changed, flush the bidi
     * cache completely.
     */
    if (conf_get_bool(term->conf, CONF_no_arabicshaping) !=
        conf_get_bool(conf, CONF_no_arabicshaping) ||
        conf_get_bool(term->conf, CONF_no_bidi) !=
        conf_get_bool(conf, CONF_no_bidi)) {
        for (i = 0; i < term->bidi_cache_size; i++) {
            sfree(term->pre_bidi_cache[i].chars);
            sfree(term->post_bidi_cache[i].chars);
            term->pre_bidi_cache[i].width = -1;
            term->pre_bidi_cache[i].chars = NULL;
            term->post_bidi_cache[i].width = -1;
            term->post_bidi_cache[i].chars = NULL;
        }
    }

    {
        const char *old_title = conf_get_str(term->conf, CONF_wintitle);
        const char *new_title = conf_get_str(conf, CONF_wintitle);
        if (strcmp(old_title, new_title)) {
            sfree(term->window_title);
            term->window_title = dupstr(new_title);
            term->wintitle_codepage = DEFAULT_CODEPAGE;
            term->win_title_pending = true;
            term_schedule_update(term);
        }
    }

    /*
     * Just setting conf is sufficient to cause colour setting changes
     * to appear on the next ESC]R palette reset. But we should also
     * check whether any colour settings have been changed, so that
     * they can be updated immediately if they haven't been overridden
     * by some escape sequence.
     */
    {
        int i, j;
        for (i = 0; i < CONF_NCOLOURS; i++) {
            for (j = 0; j < 3; j++)
                if (conf_get_int_int(term->conf, CONF_colours, i*3+j) !=
                    conf_get_int_int(conf, CONF_colours, i*3+j))
                    break;
            if (j < 3) {
                /* Actually enacting the change has to be deferred 
                 * until the new conf is installed. */
                palette_changed = true;
                break;
            }
        }
    }

    conf_free(term->conf);
    term->conf = conf_copy(conf);

    if (reset_wrap)
        term->alt_wrap = term->wrap = conf_get_bool(term->conf, CONF_wrap_mode);
    if (reset_decom)
        term->alt_om = term->dec_om = conf_get_bool(term->conf, CONF_dec_om);
    if (reset_bce) {
        term->use_bce = conf_get_bool(term->conf, CONF_bce);
        set_erase_char(term);
    }
    if (reset_tblink) {
        term->blink_is_real = conf_get_bool(term->conf, CONF_blinktext);
    }
    if (reset_charclass)
        for (i = 0; i < 256; i++)
            term->wordness[i] = conf_get_int_int(term->conf, CONF_wordness, i);

    if (conf_get_bool(term->conf, CONF_no_alt_screen))
        swap_screen(term, 0, false, false);
    if (conf_get_bool(term->conf, CONF_no_remote_charset)) {
        term->cset_attr[0] = term->cset_attr[1] = CSET_ASCII;
        term->sco_acs = term->alt_sco_acs = 0;
        term->utf = false;
    }
    if (!conf_get_str(term->conf, CONF_printer)) {
        term_print_finish(term);
    }
    if (palette_changed)
        term_notify_palette_changed(term);
    term_schedule_tblink(term);
    term_schedule_cblink(term);
    term_copy_stuff_from_conf(term);
    term_update_raw_mouse_mode(term);
}